

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void binary_example(void)

{
  int i;
  int iVar1;
  dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_R8;
  format_string<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char>_>_>_>
  fmt;
  format_string<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char>_>_>_>
  fmt_00;
  vector<char,_std::allocator<char>_> buf;
  pointer local_398;
  pointer pcStack_390;
  undefined8 local_388;
  executor local_378;
  executor local_1c8;
  
  std::vector<char,_std::allocator<char>_>::vector(&buf,0x50,(allocator_type *)&local_398);
  for (iVar1 = 0; iVar1 != 0x50; iVar1 = iVar1 + 1) {
    local_398 = (pointer)CONCAT71(local_398._1_7_,(char)iVar1);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&buf,(char *)&local_398);
  }
  local_398 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
  pcStack_390 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish;
  local_388 = 0x20;
  fmt.str_.size_ = (size_t)&local_398;
  fmt.str_.data_ = (char *)0x12;
  spdlog::
  info<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>>
            (&local_1c8,(spdlog *)"Binary example: {}",fmt,in_R8);
  spdlog::details::executor::~executor(&local_1c8);
  local_398 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
  pcStack_390 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start + 10;
  local_388 = 0x20;
  fmt_00.str_.size_ = (size_t)&local_398;
  fmt_00.str_.data_ = (char *)0x1b;
  spdlog::
  info<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>>
            (&local_378,(spdlog *)"Another binary example:{:n}",fmt_00,
             (dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
              *)in_R8);
  spdlog::details::executor::~executor(&local_378);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void binary_example()
{
    std::vector<char> buf(80);
    for (int i = 0; i < 80; i++)
    {
        buf.push_back(static_cast<char>(i & 0xff));
    }
    spdlog::info("Binary example: {}", spdlog::to_hex(buf));
    spdlog::info("Another binary example:{:n}", spdlog::to_hex(std::begin(buf), std::begin(buf) + 10));
    // more examples:
    // logger->info("uppercase: {:X}", spdlog::to_hex(buf));
    // logger->info("uppercase, no delimiters: {:Xs}", spdlog::to_hex(buf));
    // logger->info("uppercase, no delimiters, no position info: {:Xsp}", spdlog::to_hex(buf));
    // logger->info("hexdump style: {:a}", spdlog::to_hex(buf));
    // logger->info("hexdump style, 20 chars per line {:a}", spdlog::to_hex(buf, 20));
}